

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

xml_node<char> * __thiscall
rapidxml::xml_node<char>::next_sibling
          (xml_node<char> *this,char *name,size_t name_size,bool case_sensitive)

{
  bool bVar1;
  char *p1;
  size_t size1;
  xml_node<char> *local_38;
  xml_node<char> *sibling;
  size_t sStack_28;
  bool case_sensitive_local;
  size_t name_size_local;
  char *name_local;
  xml_node<char> *this_local;
  
  if ((this->super_xml_base<char>).m_parent == (xml_node<char> *)0x0) {
    __assert_fail("this->m_parent",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/rapidxml/rapidxml.hpp"
                  ,0x3ee,
                  "xml_node<Ch> *rapidxml::xml_node<>::next_sibling(const Ch *, std::size_t, bool) const [Ch = char]"
                 );
  }
  if (name == (char *)0x0) {
    this_local = this->m_next_sibling;
  }
  else {
    sStack_28 = name_size;
    if (name_size == 0) {
      sStack_28 = internal::measure<char>(name);
    }
    for (local_38 = this->m_next_sibling; local_38 != (xml_node<char> *)0x0;
        local_38 = local_38->m_next_sibling) {
      p1 = xml_base<char>::name(&local_38->super_xml_base<char>);
      size1 = xml_base<char>::name_size(&local_38->super_xml_base<char>);
      bVar1 = internal::compare<char>(p1,size1,name,sStack_28,case_sensitive);
      if (bVar1) {
        return local_38;
      }
    }
    this_local = (xml_node<char> *)0x0;
  }
  return this_local;
}

Assistant:

xml_node<Ch> *next_sibling(const Ch *name = 0, std::size_t name_size = 0, bool case_sensitive = true) const
        {
            assert(this->m_parent);     // Cannot query for siblings if node has no parent
            if (name)
            {
                if (name_size == 0)
                    name_size = internal::measure(name);
                for (xml_node<Ch> *sibling = m_next_sibling; sibling; sibling = sibling->m_next_sibling)
                    if (internal::compare(sibling->name(), sibling->name_size(), name, name_size, case_sensitive))
                        return sibling;
                return 0;
            }
            else
                return m_next_sibling;
        }